

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O3

void HBLAS2::hblas2_gemv_square_LDSame<HAXX::quaternion<double>,double,(char)78>(void)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  undefined1 auVar17 [32];
  quaternion<double> ALPHA_00;
  undefined1 auVar18 [32];
  pointer pqVar19;
  quaternion<double> *A;
  quaternion<double> *X;
  ostream *poVar20;
  basic_ostream<char,_std::char_traits<char>_> *pbVar21;
  quaternion<double> *x;
  long lVar22;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  quaternion<double> *pqVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar31 [16];
  double dVar30;
  undefined1 auVar35 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  double dVar90;
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar92 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  quaternion<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  stringstream ss;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_2a8;
  quaternion<double> local_288;
  undefined **local_268;
  undefined8 uStack_260;
  undefined8 *puStack_258;
  char **ppcStack_250;
  quaternion<double> local_248;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_228;
  undefined1 local_210 [8];
  undefined8 local_208;
  shared_count sStack_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined1 auVar36 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar59 [32];
  undefined1 auVar81 [32];
  undefined1 auVar96 [32];
  
  A = (quaternion<double> *)operator_new(320000);
  memset(A,0,320000);
  X = (quaternion<double> *)operator_new(0xc80);
  memset(X,0,0xc80);
  local_2a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0xc80);
  pqVar23 = local_2a8.
            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 100;
  local_2a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pqVar23;
  memset(local_2a8.
         super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start,0,0xc80);
  lVar22 = 0x18;
  local_2a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pqVar23;
  do {
    local_268 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar16 = _ZL3dis_1;
    dVar30 = _ZL3dis_0;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar90 = _ZL3dis_1;
    dVar1 = _ZL3dis_0;
    dVar27 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar29 = _ZL3dis_1;
    dVar2 = _ZL3dis_0;
    auVar37._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    pqVar19 = local_2a8.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    dVar15 = _ZL3dis_0;
    auVar37._8_56_ = extraout_var;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar30;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar1;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar2;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = _ZL3dis_0;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = local_268;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar16 - dVar30;
    auVar93 = vfmadd132sd_fma(auVar41,auVar49,auVar93);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar26;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar90 - dVar1;
    auVar3 = vfmadd132sd_fma(auVar50,auVar61,auVar3);
    *(long *)((long)X + lVar22 + -0x18) = auVar93._0_8_;
    dVar30 = _ZL3dis_1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar27;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar29 - dVar2;
    auVar93 = vfmadd132sd_fma(auVar62,auVar71,auVar4);
    *(long *)((long)X + lVar22 + -0x10) = auVar3._0_8_;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar30 - dVar15;
    auVar3 = vfmadd213sd_fma(auVar72,auVar37._0_16_,auVar83);
    *(long *)((long)X + lVar22 + -8) = auVar93._0_8_;
    *(long *)((long)&X->_M_real + lVar22) = auVar3._0_8_;
    lVar22 = lVar22 + 0x20;
    pqVar23 = local_2a8.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  } while (lVar22 != 0xc98);
  for (; pqVar23 != pqVar19; pqVar23 = pqVar23 + 1) {
    local_268 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar16 = _ZL3dis_1;
    dVar30 = _ZL3dis_0;
    dVar27 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar90 = _ZL3dis_1;
    dVar1 = _ZL3dis_0;
    dVar28 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar29 = _ZL3dis_1;
    dVar2 = _ZL3dis_0;
    auVar38._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    dVar26 = _ZL3dis_1;
    dVar15 = _ZL3dis_0;
    auVar38._8_56_ = extraout_var_00;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar30;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = dVar1;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar2;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = _ZL3dis_0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_268;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar16 - dVar30;
    auVar93 = vfmadd132sd_fma(auVar42,auVar51,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar27;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar90 - dVar1;
    auVar3 = vfmadd132sd_fma(auVar52,auVar63,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar28;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar29 - dVar2;
    auVar4 = vfmadd132sd_fma(auVar64,auVar73,auVar7);
    pqVar23->_M_real = auVar93._0_8_;
    pqVar23->_M_imag_i = auVar3._0_8_;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar26 - dVar15;
    auVar93 = vfmadd213sd_fma(auVar74,auVar38._0_16_,auVar84);
    pqVar23->_M_imag_j = auVar4._0_8_;
    pqVar23->_M_imag_k = auVar93._0_8_;
  }
  lVar22 = 0x18;
  do {
    local_268 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar16 = _ZL3dis_1;
    dVar30 = _ZL3dis_0;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar90 = _ZL3dis_1;
    dVar1 = _ZL3dis_0;
    dVar27 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar29 = _ZL3dis_1;
    dVar2 = _ZL3dis_0;
    auVar39._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    dVar15 = _ZL3dis_0;
    auVar39._8_56_ = extraout_var_01;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar30;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar1;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar2;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = _ZL3dis_0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_268;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar16 - dVar30;
    auVar93 = vfmadd132sd_fma(auVar43,auVar53,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar26;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar90 - dVar1;
    auVar3 = vfmadd132sd_fma(auVar54,auVar65,auVar9);
    *(long *)((long)A + lVar22 + -0x18) = auVar93._0_8_;
    dVar30 = _ZL3dis_1;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar27;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar29 - dVar2;
    auVar93 = vfmadd132sd_fma(auVar66,auVar75,auVar10);
    *(long *)((long)A + lVar22 + -0x10) = auVar3._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar30 - dVar15;
    auVar3 = vfmadd213sd_fma(auVar76,auVar39._0_16_,auVar85);
    *(long *)((long)A + lVar22 + -8) = auVar93._0_8_;
    *(long *)((long)&A->_M_real + lVar22) = auVar3._0_8_;
    lVar22 = lVar22 + 0x20;
  } while (lVar22 != 0x4e218);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&local_228,&local_2a8);
  local_268 = (undefined **)
              std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&gen);
  dVar15 = _ZL3dis_1;
  dVar30 = _ZL3dis_0;
  dVar29 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar16 = _ZL3dis_1;
  dVar1 = _ZL3dis_0;
  dVar26 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar90 = _ZL3dis_1;
  dVar2 = _ZL3dis_0;
  auVar40._0_8_ =
       std::
       generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                 (&gen);
  auVar40._8_56_ = extraout_var_02;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar30;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar1;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar2;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = _ZL3dis_0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_268;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar15 - dVar30;
  auVar93 = vfmadd132sd_fma(auVar44,auVar55,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar29;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar16 - dVar1;
  auVar3 = vfmadd132sd_fma(auVar56,auVar67,auVar12);
  local_248._M_real = auVar93._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar26;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar90 - dVar2;
  auVar93 = vfmadd132sd_fma(auVar68,auVar77,auVar13);
  local_248._M_imag_i = auVar3._0_8_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = _ZL3dis_1 - _ZL3dis_0;
  auVar3 = vfmadd213sd_fma(auVar78,auVar40._0_16_,auVar86);
  local_248._M_imag_j = auVar93._0_8_;
  local_248._M_imag_k = auVar3._0_8_;
  local_268 = (undefined **)
              std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&gen);
  dVar1 = _ZL3dis_1;
  dVar30 = _ZL3dis_0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"hblas2_gemv_square_",0x13);
  local_288._M_real = (double)CONCAT71(local_288._M_real._1_7_,0x4e);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Q",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"R",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_LDSame",7);
  std::__cxx11::stringbuf::str();
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_288._M_real,
                       CONCAT71(local_288._M_imag_i._1_7_,local_288._M_imag_i._0_1_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar20," will use",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
  std::ostream::put((char)poVar20);
  std::ostream::flush();
  if ((double *)local_288._M_real != &local_288._M_imag_j) {
    operator_delete((void *)local_288._M_real,(long)local_288._M_imag_j + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ALPHA = ",10);
  pbVar21 = HAXX::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_248);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar21 + -0x18) + (char)pbVar21);
  std::ostream::put((char)pbVar21);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  BETA = ",9);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar30;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_268;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1 - dVar30;
  auVar93 = vfmadd132sd_fma(auVar31,auVar45,auVar14);
  dVar30 = auVar93._0_8_;
  poVar20 = std::ostream::_M_insert<double>(dVar30);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
  std::ostream::put((char)poVar20);
  std::ostream::flush();
  ALPHA_00._M_imag_i = local_248._M_imag_i;
  ALPHA_00._M_real = local_248._M_real;
  ALPHA_00._M_imag_j = local_248._M_imag_j;
  ALPHA_00._M_imag_k = local_248._M_imag_k;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,double>
            ('N',100,100,ALPHA_00,A,100,X,1,dVar30,
             local_2a8.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1);
  lVar22 = 0;
  do {
    HAXX::HBLAS_DOTUV<double>
              (&local_288,100,(quaternion<double> *)((long)&A->_M_real + lVar22),100,X,1);
    uStack_260 = CONCAT71(local_288._M_imag_i._1_7_,local_288._M_imag_i._0_1_);
    local_1c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c0 = "";
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_268 = (undefined **)local_288._M_real;
    puStack_258 = (undefined8 *)local_288._M_imag_j;
    ppcStack_250 = (char **)local_288._M_imag_k;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x47,&local_1d8);
    auVar18._8_8_ = uStack_260;
    auVar18._0_8_ = local_268;
    auVar18._16_8_ = puStack_258;
    auVar18._24_8_ = ppcStack_250;
    auVar17._8_8_ = local_248._M_imag_i;
    auVar17._0_8_ = local_248._M_real;
    auVar17._16_8_ = local_248._M_imag_j;
    auVar17._24_8_ = local_248._M_imag_k;
    auVar35 = vpermpd_avx2(auVar18,0xe9);
    auVar93 = auVar18._16_16_;
    auVar25 = vpermpd_avx2(auVar18,0xe7);
    auVar24 = vshufpd_avx(auVar17,auVar17,0xb);
    auVar47 = vpermpd_avx2(auVar17,0x7a);
    auVar17 = vpermpd_avx2(auVar17,0x9f);
    auVar36 = vpermpd_avx2(auVar18,1);
    auVar58._16_16_ = auVar35._0_16_;
    auVar58._0_16_ = auVar93;
    auVar93 = vshufpd_avx(auVar93,auVar93,1);
    auVar80._0_8_ = auVar24._0_8_ * auVar36._0_8_;
    auVar80._8_8_ = auVar24._8_8_ * auVar36._8_8_;
    auVar80._16_8_ = auVar24._16_8_ * auVar36._16_8_;
    auVar80._24_8_ = auVar24._24_8_ * auVar36._24_8_;
    auVar35._0_8_ = auVar93._0_8_ * auVar17._0_8_;
    auVar35._8_8_ = auVar93._8_8_ * auVar17._8_8_;
    auVar35._16_8_ = auVar25._0_8_ * auVar17._16_8_;
    auVar35._24_8_ = auVar25._8_8_ * auVar17._24_8_;
    auVar24._8_8_ = local_248._M_real;
    auVar24._0_8_ = local_248._M_real;
    auVar24._16_8_ = local_248._M_real;
    auVar24._24_8_ = local_248._M_real;
    auVar24 = vfmsub231pd_avx512vl(auVar35,auVar18,auVar24);
    auVar93 = vfmadd213pd_fma(auVar58,auVar47,auVar80);
    auVar32._0_8_ = auVar24._0_8_ + -auVar93._0_8_;
    auVar32._8_8_ = auVar24._8_8_ + auVar93._8_8_;
    auVar25._16_8_ = auVar24._16_8_ + 0.0;
    auVar25._0_16_ = auVar32;
    auVar25._24_8_ = auVar24._24_8_ + 0.0;
    auVar93 = vshufpd_avx(auVar32,auVar32,1);
    dVar15 = dVar30 * *(double *)
                       ((long)&(local_228.
                                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar22) +
             auVar32._0_8_;
    dVar1 = *(double *)
             ((long)&(local_2a8.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_imag_j + lVar22);
    auVar94._8_8_ = 0;
    auVar94._0_8_ = dVar1;
    dVar2 = *(double *)
             ((long)&(local_2a8.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_imag_k + lVar22);
    auVar97._8_8_ = 0;
    auVar97._0_8_ = dVar2;
    dVar16 = dVar30 * *(double *)
                       ((long)&(local_228.
                                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_imag_i + lVar22) +
             auVar93._0_8_;
    auVar33._8_8_ = dVar15;
    auVar33._0_8_ = dVar15;
    auVar36._16_8_ = dVar15;
    auVar36._0_16_ = auVar33;
    auVar36._24_8_ = dVar15;
    dVar90 = dVar30 * *(double *)
                       ((long)&(local_228.
                                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_imag_j + lVar22) +
             auVar25._16_8_;
    auVar89._8_8_ = dVar16;
    auVar89._0_8_ = dVar16;
    auVar93 = vshufpd_avx(auVar25._16_16_,auVar25._16_16_,1);
    dVar15 = *(double *)
              ((long)&(local_2a8.
                       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_imag_i + lVar22);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = dVar15;
    dVar29 = dVar30 * *(double *)
                       ((long)&(local_228.
                                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_imag_k + lVar22) +
             auVar93._0_8_;
    dVar16 = *(double *)
              ((long)&(local_2a8.
                       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar22);
    local_288._M_imag_i._0_1_ = 0;
    local_1f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_1f0 = "";
    auVar69._8_8_ = dVar90;
    auVar69._0_8_ = dVar90;
    auVar93 = vunpcklpd_avx(auVar33,auVar89);
    auVar47._16_16_ = auVar69;
    auVar47._0_16_ = auVar93;
    auVar57._8_8_ = dVar29;
    auVar57._0_8_ = dVar29;
    auVar59._16_8_ = dVar29;
    auVar59._0_16_ = auVar57;
    auVar59._24_8_ = dVar29;
    auVar24 = vblendpd_avx(auVar47,auVar59,8);
    auVar93 = vunpckhpd_avx(auVar57,auVar89);
    auVar60._16_16_ = auVar93;
    auVar60._0_16_ = auVar69;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = dVar16 * dVar16;
    auVar93 = vfmadd231sd_fma(auVar91,auVar87,auVar87);
    auVar93 = vfmadd231sd_fma(auVar93,auVar94,auVar94);
    auVar93 = vfmadd231sd_fma(auVar93,auVar97,auVar97);
    auVar93 = vsqrtsd_avx(auVar93,auVar93);
    dVar90 = auVar93._0_8_;
    auVar79._0_8_ = (dVar16 / dVar90) / dVar90;
    auVar95._0_8_ = (-dVar1 / dVar90) / dVar90;
    auVar88._0_8_ = (-dVar15 / dVar90) / dVar90;
    auVar88._8_8_ = 0x8000000000000000;
    auVar92._0_8_ = (-dVar2 / dVar90) / dVar90;
    auVar79._8_8_ = auVar79._0_8_;
    auVar81._16_8_ = auVar79._0_8_;
    auVar81._0_16_ = auVar79;
    auVar81._24_8_ = auVar79._0_8_;
    auVar95._8_8_ = auVar95._0_8_;
    auVar96._16_8_ = auVar95._0_8_;
    auVar96._0_16_ = auVar95;
    auVar96._24_8_ = auVar95._0_8_;
    auVar92._8_8_ = auVar92._0_8_;
    auVar92._16_8_ = auVar92._0_8_;
    auVar92._24_8_ = auVar92._0_8_;
    auVar93 = vunpcklpd_avx(auVar79,auVar88);
    auVar3 = vunpcklpd_avx(auVar88,auVar79);
    auVar35 = vblendpd_avx(ZEXT1632(auVar93),auVar96,4);
    auVar25 = vblendpd_avx(ZEXT1632(auVar3),auVar81,0xc);
    auVar93 = vunpcklpd_avx(auVar88,auVar95);
    auVar35 = vblendpd_avx(auVar35,auVar92,8);
    auVar47 = vshufpd_avx(auVar24,auVar24,0xb);
    auVar24 = vpermpd_avx2(auVar24,0x9f);
    auVar70._0_8_ = auVar47._0_8_ * auVar25._0_8_;
    auVar70._8_8_ = auVar47._8_8_ * auVar25._8_8_;
    auVar70._16_8_ = auVar47._16_8_ * auVar25._16_8_;
    auVar70._24_8_ = auVar47._24_8_ * auVar25._24_8_;
    auVar82._16_16_ = auVar93;
    auVar82._0_16_ = auVar35._16_16_;
    auVar93 = vfmadd231pd_fma(auVar70,auVar60,auVar82);
    auVar25 = vpermt2pd_avx512f(_DAT_002447c0,ZEXT1632(auVar88));
    auVar48._0_8_ = auVar25._0_8_ * auVar24._0_8_;
    auVar48._8_8_ = auVar25._8_8_ * auVar24._8_8_;
    auVar48._16_8_ = auVar25._16_8_ * auVar24._16_8_;
    auVar48._24_8_ = auVar25._24_8_ * auVar24._24_8_;
    auVar3 = vfmsub231pd_fma(auVar48,auVar36,auVar35);
    auVar34._0_8_ = auVar3._0_8_ + -auVar93._0_8_;
    auVar34._8_8_ = auVar3._8_8_ + auVar93._8_8_;
    auVar93 = vshufpd_avx(auVar34,auVar34,1);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = (auVar34._0_8_ + -1.0) * (auVar34._0_8_ + -1.0);
    auVar93 = vfmadd213sd_fma(auVar93,auVar93,auVar46);
    auVar3 = vfmadd231sd_fma(auVar93,(undefined1  [16])0x0,(undefined1  [16])0x0);
    auVar93 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
    auVar93 = vfmadd213sd_fma(auVar93,auVar93,auVar3);
    auVar93 = vsqrtsd_avx(auVar93,auVar93);
    local_210[0] = auVar93._0_8_ < 1e-12;
    local_208 = 0;
    sStack_200.pi_ = (sp_counted_base *)0x0;
    local_1e8 = "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )";
    local_1e0 = "";
    local_288._M_real = (double)&PTR__lazy_ostream_002658f0;
    local_288._M_imag_j = (double)&boost::unit_test::lazy_ostream::inst;
    local_288._M_imag_k = (double)&local_1e8;
    boost::test_tools::tt_detail::report_assertion(local_210,&local_288,&local_1f8,0x47,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_200);
    lVar22 = lVar22 + 0x20;
  } while (lVar22 != 0xc80);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_228.
      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.
      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (quaternion<double> *)0x0) {
    operator_delete(local_2a8.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(X,0xc80);
  operator_delete(A,320000);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(hblas2_gemv_square_CQR_LDSame) {
  hblas2_gemv_square_LDSame<HAXX::quaternion<double>,double,'C'>(); 
}